

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

void __thiscall
inja::Environment::Environment(Environment *this,string *input_path,string *output_path)

{
  pointer pIVar1;
  string *output_path_local;
  string *input_path_local;
  Environment *this_local;
  
  stdinja::make_unique<inja::Environment::Impl>();
  pIVar1 = std::unique_ptr<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>::
           operator->(&this->m_impl);
  std::__cxx11::string::operator=((string *)pIVar1,(string *)input_path);
  pIVar1 = std::unique_ptr<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>::
           operator->(&this->m_impl);
  std::__cxx11::string::operator=((string *)&pIVar1->output_path,(string *)output_path);
  return;
}

Assistant:

explicit Environment(const std::string& input_path, const std::string& output_path)
		: m_impl(stdinja::make_unique<Impl>()) {
		m_impl->input_path = input_path;
		m_impl->output_path = output_path;
	}